

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int X509V3_ext(Curl_easy *data,int certnum,stack_st_X509_EXTENSION *exts)

{
  int iVar1;
  int iVar2;
  OPENSSL_STACK *pOVar3;
  BIO_METHOD *type;
  BIO *out;
  ASN1_OCTET_STRING *v;
  bool bVar4;
  char *local_2f8;
  char *sep;
  BIO *bio_out;
  char namebuf [128];
  char **local_260;
  char *ptr;
  char buf [512];
  ulong *local_50;
  BUF_MEM *biomem;
  X509_EXTENSION *ext;
  ASN1_OBJECT *obj;
  size_t j;
  stack_st_X509_EXTENSION *psStack_28;
  int i;
  stack_st_X509_EXTENSION *exts_local;
  Curl_easy *pCStack_18;
  int certnum_local;
  Curl_easy *data_local;
  
  psStack_28 = exts;
  exts_local._4_4_ = certnum;
  pCStack_18 = data;
  pOVar3 = ossl_check_const_X509_EXTENSION_sk_type(exts);
  iVar1 = OPENSSL_sk_num(pOVar3);
  if (iVar1 < 1) {
    data_local._4_4_ = 1;
  }
  else {
    j._4_4_ = 0;
    while( true ) {
      iVar1 = j._4_4_;
      pOVar3 = ossl_check_const_X509_EXTENSION_sk_type(psStack_28);
      iVar2 = OPENSSL_sk_num(pOVar3);
      if (iVar2 <= iVar1) break;
      pOVar3 = ossl_check_const_X509_EXTENSION_sk_type(psStack_28);
      biomem = (BUF_MEM *)OPENSSL_sk_value(pOVar3,j._4_4_);
      local_260 = &ptr;
      type = BIO_s_mem();
      out = BIO_new(type);
      if (out == (BIO *)0x0) {
        return 1;
      }
      ext = (X509_EXTENSION *)X509_EXTENSION_get_object((X509_EXTENSION *)biomem);
      asn1_object_dump((ASN1_OBJECT *)ext,(char *)&bio_out,0x80);
      iVar1 = X509V3_EXT_print(out,(X509_EXTENSION *)biomem,0,0);
      if (iVar1 == 0) {
        v = X509_EXTENSION_get_data((X509_EXTENSION *)biomem);
        ASN1_STRING_print(out,v);
      }
      BIO_ctrl(out,0x73,0,&local_50);
      for (obj = (ASN1_OBJECT *)0x0; obj < (ASN1_OBJECT *)*local_50; obj = obj + 1) {
        local_2f8 = "";
        if (obj[local_50[1]] == (ASN1_OBJECT)0xa) {
          local_2f8 = ", ";
          obj = obj + 1;
        }
        while( true ) {
          bVar4 = false;
          if (obj < (ASN1_OBJECT *)*local_50) {
            bVar4 = obj[local_50[1]] == (ASN1_OBJECT)0x20;
          }
          if (!bVar4) break;
          obj = obj + 1;
        }
        if (obj < (ASN1_OBJECT *)*local_50) {
          iVar1 = curl_msnprintf((char *)local_260,0x200 - ((long)local_260 - (long)&ptr),"%s%c",
                                 local_2f8,(ulong)(uint)(int)(char)obj[local_50[1]]);
          local_260 = (char **)((long)local_260 + (long)iVar1);
        }
      }
      Curl_ssl_push_certinfo(pCStack_18,exts_local._4_4_,(char *)&bio_out,(char *)&ptr);
      BIO_free(out);
      j._4_4_ = j._4_4_ + 1;
    }
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

static int X509V3_ext(struct Curl_easy *data,
                      int certnum,
                      CONST_EXTS STACK_OF(X509_EXTENSION) *exts)
{
  int i;
  size_t j;

  if((int)sk_X509_EXTENSION_num(exts) <= 0)
    /* no extensions, bail out */
    return 1;

  for(i = 0; i < (int)sk_X509_EXTENSION_num(exts); i++) {
    ASN1_OBJECT *obj;
    X509_EXTENSION *ext = sk_X509_EXTENSION_value(exts, i);
    BUF_MEM *biomem;
    char buf[512];
    char *ptr = buf;
    char namebuf[128];
    BIO *bio_out = BIO_new(BIO_s_mem());

    if(!bio_out)
      return 1;

    obj = X509_EXTENSION_get_object(ext);

    asn1_object_dump(obj, namebuf, sizeof(namebuf));

    if(!X509V3_EXT_print(bio_out, ext, 0, 0))
      ASN1_STRING_print(bio_out, (ASN1_STRING *)X509_EXTENSION_get_data(ext));

    BIO_get_mem_ptr(bio_out, &biomem);

    for(j = 0; j < (size_t)biomem->length; j++) {
      const char *sep = "";
      if(biomem->data[j] == '\n') {
        sep = ", ";
        j++; /* skip the newline */
      };
      while((j<(size_t)biomem->length) && (biomem->data[j] == ' '))
        j++;
      if(j<(size_t)biomem->length)
        ptr += snprintf(ptr, sizeof(buf)-(ptr-buf), "%s%c", sep,
                        biomem->data[j]);
    }

    Curl_ssl_push_certinfo(data, certnum, namebuf, buf);

    BIO_free(bio_out);

  }
  return 0; /* all is fine */
}